

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  undefined4 *puVar4;
  BuildRef *pBVar5;
  long *plVar6;
  Vec3fx *pVVar7;
  int iVar8;
  uint uVar9;
  Geometry *pGVar10;
  BVH *pBVar11;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  BuildRef *pBVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  ThreadLocal2 *this_02;
  ulong uVar20;
  float *pfVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  float *pfVar25;
  long lVar26;
  size_t sVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  PrimInfo pinfo;
  undefined8 local_178;
  float fStack_170;
  float fStack_16c;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  PrimRef *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128 [8];
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8 [8];
  RefBuilderSmall *local_d8;
  long *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  long local_48;
  long local_40;
  
  sVar27 = this->objectID_;
  pGVar10 = (topBuilder->scene->geometries).items[sVar27].ptr;
  uVar9 = pGVar10->numPrimitives;
  uVar28 = CONCAT44(0,uVar9);
  lVar23 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_160._0_8_ = lVar23 + 0x550;
  if (lVar23 == 0) {
    local_160._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_160[8] = false;
  local_150 = (undefined1  [16])0x0;
  local_140 = (PrimRef *)0x0;
  local_d8 = this;
  if (uVar28 != 0) {
    sVar27 = uVar28 << 5;
    (**((MemoryMonitorInterface *)local_160._0_8_)->_vptr_MemoryMonitorInterface)
              (local_160._0_8_,sVar27,0);
    if (uVar9 < 0xe0000) {
      local_140 = (PrimRef *)alignedMalloc(sVar27,0x20);
    }
    else {
      local_140 = (PrimRef *)os_malloc(sVar27,(bool *)(local_160 + 8));
    }
    local_150._8_4_ = uVar9;
    local_150._0_8_ = uVar28;
    local_150._12_4_ = 0;
    sVar27 = local_d8->objectID_;
  }
  sse2::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar10,(uint)sVar27,uVar28,(mvector<PrimRef> *)local_160
             ,&(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_d0 = (long *)__tls_get_addr(&PTR_021a7d38);
    uVar28 = 0;
    do {
      pBVar11 = topBuilder->bvh;
      this_02 = (ThreadLocal2 *)*local_d0;
      if (this_02 == (ThreadLocal2 *)0x0) {
        this_02 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_02);
        (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_02->alloc0).parent = this_02;
        (this_02->alloc0).ptr = (char *)0x0;
        (this_02->alloc0).cur = 0;
        (this_02->alloc0).end = 0;
        (this_02->alloc0).allocBlockSize = 0;
        (this_02->alloc0).bytesUsed = 0;
        (this_02->alloc0).bytesWasted = 0;
        (this_02->alloc1).parent = this_02;
        (this_02->alloc1).ptr = (char *)0x0;
        (this_02->alloc1).cur = 0;
        (this_02->alloc1).end = 0;
        (this_02->alloc1).allocBlockSize = 0;
        (this_02->alloc1).bytesUsed = 0;
        (this_02->alloc1).bytesWasted = 0;
        *local_d0 = (long)this_02;
        local_138 = &FastAllocator::s_thread_local_allocators_lock;
        uStack_130 = CONCAT71(uStack_130._1_7_,1);
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_108 = this_02;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_108);
        if (local_108 != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_108,local_108);
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      }
      this_00 = &pBVar11->alloc;
      uVar22 = (ulong)(((pBVar11->alloc).use_single_mode ^ 1) << 6);
      local_178 = 0xb0;
      this_01._M_t.
      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
           ((__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             *)((long)&(this_02->alloc0).parent + uVar22))->_M_t;
      if (this_00 !=
          (((atomic<embree::FastAllocator_*> *)
           ((long)this_01._M_t.
                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl
           + 8))->_M_b)._M_p) {
        uStack_100 = CONCAT71(uStack_100._1_7_,1);
        local_108 = (ThreadLocal2 *)this_01;
        MutexSys::lock((MutexSys *)
                       this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl);
        if ((((atomic<embree::FastAllocator_*> *)
             ((long)this_01._M_t.
                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                    _M_head_impl + 8))->_M_b)._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((((atomic<embree::FastAllocator_*> *)
                      ((long)this_01._M_t.
                             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                             _M_head_impl + 8))->_M_b)._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (long)*(void **)((long)this_01._M_t.
                                      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                      .
                                      super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                      ._M_head_impl + 0xa8) +
               (long)*(void **)((long)this_01._M_t.
                                      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                      .
                                      super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                      ._M_head_impl + 0x68);
          UNLOCK();
          LOCK();
          paVar1 = &((((atomic<embree::FastAllocator_*> *)
                      ((long)this_01._M_t.
                             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                             _M_head_impl + 8))->_M_b)._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((long)*(void **)((long)this_01._M_t.
                                        super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                        .
                                        super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                        ._M_head_impl + 0x58) +
                (long)*(void **)((long)this_01._M_t.
                                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                       .
                                       super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                       ._M_head_impl + 0x98)) -
               ((long)*(void **)((long)this_01._M_t.
                                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                       .
                                       super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                       ._M_head_impl + 0x50) +
               (long)*(void **)((long)this_01._M_t.
                                      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                      .
                                      super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                      ._M_head_impl + 0x90)));
          UNLOCK();
          LOCK();
          paVar1 = &((((atomic<embree::FastAllocator_*> *)
                      ((long)this_01._M_t.
                             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                             _M_head_impl + 8))->_M_b)._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (long)*(void **)((long)this_01._M_t.
                                      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                      .
                                      super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                      ._M_head_impl + 0xb0) +
               (long)*(void **)((long)this_01._M_t.
                                      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                      .
                                      super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                      ._M_head_impl + 0x70);
          UNLOCK();
        }
        *(undefined1 (*) [16])
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x68) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x58) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x48) = (undefined1  [16])0x0;
        *(void **)((long)this_01._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 0x60) = (void *)(pBVar11->alloc).defaultBlockSize;
        *(undefined1 (*) [16])
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x88) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x98) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0xa8) = (undefined1  [16])0x0;
        *(void **)((long)this_01._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 0xa0) = (void *)(pBVar11->alloc).defaultBlockSize;
        LOCK();
        (((atomic<embree::FastAllocator_*> *)
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         8))->_M_b)._M_p = this_00;
        UNLOCK();
        local_138 = &FastAllocator::s_thread_local_allocators_lock;
        uStack_130 = CONCAT71(uStack_130._1_7_,1);
        local_c8 = (ThreadLocal2 *)this_01;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar11->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar11->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar11->alloc).thread_local_allocators,__position,
                     (ThreadLocal2 **)&local_c8);
        }
        else {
          *__position._M_current = local_c8;
          pppTVar2 = &(pBVar11->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        if ((char)uStack_100 == '\x01') {
          MutexSys::unlock(&local_108->mutex);
        }
      }
      plVar6 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar22);
      *plVar6 = *plVar6 + local_178;
      lVar23 = *(long *)((long)&(this_02->alloc0).cur + uVar22);
      uVar24 = (ulong)(-(int)lVar23 & 0xf);
      uVar20 = lVar23 + local_178 + uVar24;
      *(ulong *)((long)&(this_02->alloc0).cur + uVar22) = uVar20;
      if (*(ulong *)((long)&(this_02->alloc0).end + uVar22) < uVar20) {
        *(long *)((long)&(this_02->alloc0).cur + uVar22) = lVar23;
        uVar20 = *(ulong *)((long)&(this_02->alloc0).allocBlockSize + uVar22);
        if (uVar20 < local_178 << 2) {
          pfVar21 = (float *)FastAllocator::malloc(this_00,(size_t)&local_178);
        }
        else {
          local_138 = (undefined8 *)uVar20;
          pfVar21 = (float *)FastAllocator::malloc(this_00,(size_t)&local_138);
          *(float **)((long)&(this_02->alloc0).ptr + uVar22) = pfVar21;
          lVar23 = (*(long *)((long)&(this_02->alloc0).end + uVar22) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar22)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar22);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar22) = lVar23;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar22) = 0;
          *(undefined8 **)((long)&(this_02->alloc0).end + uVar22) = local_138;
          *(ulong *)((long)&(this_02->alloc0).cur + uVar22) = local_178;
          if (local_138 < local_178) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar22) = 0;
            local_138 = *(undefined8 **)((long)&(this_02->alloc0).allocBlockSize + uVar22);
            pfVar21 = (float *)FastAllocator::malloc(this_00,(size_t)&local_138);
            *(float **)((long)&(this_02->alloc0).ptr + uVar22) = pfVar21;
            lVar23 = (*(long *)((long)&(this_02->alloc0).end + uVar22) -
                     *(long *)((long)&(this_02->alloc0).cur + uVar22)) +
                     *(long *)((long)&(this_02->alloc0).bytesWasted + uVar22);
            *(long *)((long)&(this_02->alloc0).bytesWasted + uVar22) = lVar23;
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar22) = 0;
            *(undefined8 **)((long)&(this_02->alloc0).end + uVar22) = local_138;
            *(ulong *)((long)&(this_02->alloc0).cur + uVar22) = local_178;
            if (local_138 < local_178) {
              *(undefined8 *)((long)&(this_02->alloc0).cur + uVar22) = 0;
              pfVar21 = (float *)0x0;
              goto LAB_00ca4981;
            }
          }
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar22) = lVar23;
        }
      }
      else {
        plVar6 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar22);
        *plVar6 = *plVar6 + uVar24;
        pfVar21 = (float *)((uVar20 - local_178) + *(long *)((long)&(this_02->alloc0).ptr + uVar22))
        ;
      }
LAB_00ca4981:
      uVar22 = local_40 - local_48;
      local_178 = 0xffffffffffffffff;
      fStack_170 = -NAN;
      fStack_16c = -NAN;
      local_b8[8] = -NAN;
      local_b8[9] = -NAN;
      local_b8[10] = -NAN;
      local_b8[0xb] = -NAN;
      fVar29 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      local_128[4] = 0.0;
      local_128[5] = 0.0;
      local_128[6] = 0.0;
      local_128[7] = 0.0;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      local_128[3] = 0.0;
      local_138 = (undefined8 *)0x0;
      uStack_130 = 0;
      local_f8[4] = 0.0;
      local_f8[5] = 0.0;
      local_f8[6] = 0.0;
      local_f8[7] = 0.0;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      local_108 = (ThreadLocal2 *)0x0;
      uStack_100 = 0;
      local_b8[4] = 0.0;
      local_b8[5] = 0.0;
      local_b8[6] = 0.0;
      local_b8[7] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      local_c8 = (ThreadLocal2 *)0x0;
      uStack_c0 = 0;
      if (uVar28 < uVar22) {
        pRVar12 = (topBuilder->bvh->scene->geometries).items;
        pfVar25 = local_140[uVar28].upper.field_0.m128 + 3;
        uVar20 = 0;
        do {
          fVar29 = *pfVar25;
          pGVar10 = pRVar12[(uint)pfVar25[-4]].ptr;
          lVar26 = (ulong)(uint)fVar29 *
                   pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar23 = *(long *)&pGVar10->field_0x58;
          lVar13 = *(long *)&pGVar10[1].time_range.upper;
          p_Var14 = pGVar10[1].intersectionFilterN;
          puVar4 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar23 + lVar26) * (long)p_Var14);
          uVar16 = *puVar4;
          fVar30 = (float)puVar4[1];
          fVar31 = (float)puVar4[2];
          puVar4 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar23 + 4 + lVar26) * (long)p_Var14);
          uVar17 = *puVar4;
          fVar32 = (float)puVar4[1];
          fVar33 = (float)puVar4[2];
          puVar4 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar23 + 8 + lVar26) * (long)p_Var14);
          uVar18 = *puVar4;
          fVar34 = (float)puVar4[1];
          fVar35 = (float)puVar4[2];
          *(float *)((long)&local_178 + uVar20 * 4) = pfVar25[-4];
          local_b8[uVar20 + 8] = fVar29;
          *(undefined4 *)((long)&local_138 + uVar20 * 4) = uVar16;
          local_128[uVar20] = fVar30;
          local_128[uVar20 + 4] = fVar31;
          *(undefined4 *)((long)&local_108 + uVar20 * 4) = uVar17;
          local_f8[uVar20] = fVar32;
          local_f8[uVar20 + 4] = fVar33;
          *(undefined4 *)((long)&local_c8 + uVar20 * 4) = uVar18;
          local_b8[uVar20] = fVar34;
          local_b8[uVar20 + 4] = fVar35;
          uVar24 = uVar20 + 1;
          if (2 < uVar20) break;
          lVar23 = uVar20 + uVar28;
          pfVar25 = pfVar25 + 8;
          uVar20 = uVar24;
        } while (lVar23 + 1U < uVar22);
        uVar28 = uVar28 + uVar24;
        fVar29 = local_b8[4];
        fVar30 = local_b8[5];
        fVar31 = local_b8[6];
        fVar32 = local_b8[7];
        fVar33 = local_b8[0];
        fVar34 = local_b8[1];
        fVar35 = local_b8[2];
        fVar36 = local_b8[3];
        fVar37 = local_128[4];
        fVar38 = local_128[5];
        fVar39 = local_128[6];
        fVar40 = local_128[7];
        fVar41 = local_128[0];
        fVar42 = local_128[1];
        fVar43 = local_128[2];
        fVar44 = local_128[3];
        fVar45 = local_f8[4];
        fVar46 = local_f8[5];
        fVar47 = local_f8[6];
        fVar48 = local_f8[7];
        fVar49 = local_f8[0];
        fVar50 = local_f8[1];
        fVar51 = local_f8[2];
        fVar52 = local_f8[3];
      }
      else {
        local_178._0_4_ = -NAN;
        local_178._4_4_ = -NAN;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        local_c8._0_4_ = 0.0;
        local_c8._4_4_ = 0.0;
        uStack_c0._0_4_ = 0.0;
        uStack_c0._4_4_ = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar51 = 0.0;
        fVar52 = 0.0;
        local_108._0_4_ = 0.0;
        local_108._4_4_ = 0.0;
        uStack_100._0_4_ = 0.0;
        uStack_100._4_4_ = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        local_138._0_4_ = 0.0;
        local_138._4_4_ = 0.0;
        uStack_130._0_4_ = 0.0;
        uStack_130._4_4_ = 0.0;
      }
      *pfVar21 = (float)local_138;
      pfVar21[1] = local_138._4_4_;
      pfVar21[2] = (float)uStack_130;
      pfVar21[3] = uStack_130._4_4_;
      pfVar21[4] = fVar41;
      pfVar21[5] = fVar42;
      pfVar21[6] = fVar43;
      pfVar21[7] = fVar44;
      pfVar21[8] = fVar37;
      pfVar21[9] = fVar38;
      pfVar21[10] = fVar39;
      pfVar21[0xb] = fVar40;
      pfVar21[0xc] = (float)local_138 - (float)local_108;
      pfVar21[0xd] = local_138._4_4_ - local_108._4_4_;
      pfVar21[0xe] = (float)uStack_130 - (float)uStack_100;
      pfVar21[0xf] = uStack_130._4_4_ - uStack_100._4_4_;
      pfVar21[0x10] = fVar41 - fVar49;
      pfVar21[0x11] = fVar42 - fVar50;
      pfVar21[0x12] = fVar43 - fVar51;
      pfVar21[0x13] = fVar44 - fVar52;
      pfVar21[0x14] = fVar37 - fVar45;
      pfVar21[0x15] = fVar38 - fVar46;
      pfVar21[0x16] = fVar39 - fVar47;
      pfVar21[0x17] = fVar40 - fVar48;
      pfVar21[0x18] = (float)local_c8 - (float)local_138;
      pfVar21[0x19] = local_c8._4_4_ - local_138._4_4_;
      pfVar21[0x1a] = (float)uStack_c0 - (float)uStack_130;
      pfVar21[0x1b] = uStack_c0._4_4_ - uStack_130._4_4_;
      pfVar21[0x1c] = fVar33 - fVar41;
      pfVar21[0x1d] = fVar34 - fVar42;
      pfVar21[0x1e] = fVar35 - fVar43;
      pfVar21[0x1f] = fVar36 - fVar44;
      pfVar21[0x20] = fVar29 - fVar37;
      pfVar21[0x21] = fVar30 - fVar38;
      pfVar21[0x22] = fVar31 - fVar39;
      pfVar21[0x23] = fVar32 - fVar40;
      pfVar21[0x24] = (float)local_178;
      pfVar21[0x25] = local_178._4_4_;
      pfVar21[0x26] = fStack_170;
      pfVar21[0x27] = fStack_16c;
      pfVar21[0x28] = local_b8[8];
      pfVar21[0x29] = local_b8[9];
      pfVar21[0x2a] = local_b8[10];
      pfVar21[0x2b] = local_b8[0xb];
      fVar29 = *(float *)&local_d8->objectID_;
      LOCK();
      paVar3 = &topBuilder->nextRef;
      iVar8 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar15 = (topBuilder->refs).items;
      pBVar5 = pBVar15 + iVar8;
      (pBVar5->super_PrimRef).lower.field_0.m128[0] = local_88.m128[0];
      (pBVar5->super_PrimRef).lower.field_0.m128[1] = local_88.m128[1];
      (pBVar5->super_PrimRef).lower.field_0.m128[2] = local_88.m128[2];
      (pBVar5->super_PrimRef).lower.field_0.m128[3] = fVar29;
      pVVar7 = &pBVar15[iVar8].super_PrimRef.upper;
      (pVVar7->field_0).m128[0] = local_78;
      (pVVar7->field_0).m128[1] = fStack_74;
      (pVVar7->field_0).m128[2] = fStack_70;
      (pVVar7->field_0).m128[3] = 1.4013e-45;
      pBVar15[iVar8].node.ptr = (ulong)pfVar21 | 9;
      pBVar15[iVar8].bounds_area = 0.0;
    } while (uVar28 < (ulong)(local_40 - local_48));
  }
  uVar19 = local_150._8_8_;
  if (local_140 != (PrimRef *)0x0) {
    if ((ulong)(local_150._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_140);
    }
    else {
      os_free(local_140,local_150._8_8_ << 5,local_160[8]);
    }
  }
  if (uVar19 != 0) {
    (***(_func_int ***)local_160._0_8_)(local_160._0_8_,uVar19 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }